

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O2

CURLcode curl_ws_send(CURL *data,void *buffer,size_t buflen,size_t *sent,curl_off_t fragsize,
                     uint flags)

{
  undefined8 uVar1;
  curl_trc_feat *pcVar2;
  websocket *pwVar3;
  bufq *q;
  ulong uVar4;
  uint uVar5;
  _Bool _Var6;
  CURLcode CVar7;
  connectdata *pcVar8;
  size_t sVar9;
  size_t sVar10;
  ssize_t sVar11;
  size_t *psVar12;
  char *fmt;
  CURLcode local_64;
  bufq *local_60;
  websocket *local_58;
  size_t local_50;
  uint local_44;
  size_t local_40;
  ws_encoder *local_38;
  
  psVar12 = sent;
  if ((((data != (CURL *)0x0) &&
       (uVar1 = *(undefined8 *)&(data->set).field_0x8ca, ((uint)uVar1 >> 0x1c & 1) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < Curl_trc_feat_ws.log_level)) {
    psVar12 = (size_t *)fragsize;
    Curl_trc_ws(data,"curl_ws_send(len=%zu, fragsize=%ld, flags=%x), raw=%d",buflen,fragsize,
                (ulong)flags,(ulong)((uint)((ulong)uVar1 >> 0x35) & 1));
  }
  *sent = 0;
  pcVar8 = data->conn;
  if (pcVar8 == (connectdata *)0x0) {
    CVar7 = local_64;
    if ((data->set).connect_only != '\0') {
      CVar7 = Curl_connect_only_attach(data);
      if (CVar7 != CURLE_OK) goto LAB_00160883;
      pcVar8 = data->conn;
      local_64 = CURLE_OK;
      CVar7 = CURLE_OK;
      if (pcVar8 != (connectdata *)0x0) goto LAB_0016077f;
    }
    local_64 = CVar7;
    fmt = "No associated connection";
  }
  else {
LAB_0016077f:
    pwVar3 = (pcVar8->proto).ws;
    local_58 = (websocket *)buffer;
    if (pwVar3 != (websocket *)0x0) {
      local_64 = ws_flush(data,pwVar3,false);
      CVar7 = local_64;
      if (local_64 != CURLE_OK) goto LAB_00160883;
      if (((data->set).field_0x8d0 & 0x20) != 0) {
        sVar9 = CONCAT71((int7)((ulong)psVar12 >> 8),flags == 0);
        if (fragsize != 0 || flags != 0) {
          Curl_failf(data,"ws_send, raw mode: fragsize and flags cannot be non-zero");
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        pwVar3 = (data->conn->proto).ws;
        if (pwVar3 == (websocket *)0x0) {
          Curl_failf(data,"Not a websocket transfer");
          CVar7 = CURLE_SEND_ERROR;
        }
        else if (buflen == 0) {
          CVar7 = CURLE_OK;
        }
        else {
          _Var6 = Curl_is_in_callback(data);
          if (_Var6) {
            CVar7 = ws_flush(data,pwVar3,true);
            if (CVar7 != CURLE_OK) goto LAB_00160883;
            CVar7 = ws_send_raw_blocking(data,local_58,(char *)buflen,sVar9);
          }
          else {
            CVar7 = ws_flush(data,pwVar3,false);
            if (CVar7 != CURLE_OK) goto LAB_00160883;
            CVar7 = Curl_senddata(data,local_58,buflen,sent);
          }
          if ((((data->set).field_0x8cd & 0x10) != 0) &&
             (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
               (0 < pcVar2->log_level)) && (0 < Curl_trc_feat_ws.log_level)))) {
            Curl_trc_ws(data,"ws_send_raw(len=%zu) -> %d, %zu",buflen,(ulong)CVar7,*sent);
          }
        }
        goto LAB_00160883;
      }
      local_60 = &pwVar3->sendbuf;
      local_50 = fragsize;
      sVar9 = Curl_bufq_space(local_60);
      if (((((data->set).field_0x8cd & 0x10) != 0) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < Curl_trc_feat_ws.log_level)) {
        sVar10 = Curl_bufq_len(local_60);
        Curl_trc_ws(data,"curl_ws_send(len=%zu), sendbuf=%zu space_left=%zu",buflen,sVar10,sVar9);
      }
      fragsize = local_50;
      if (sVar9 < 0xe) {
        local_64 = CURLE_AGAIN;
        CVar7 = local_64;
        goto LAB_00160883;
      }
      if ((flags & 0x20) == 0) {
        sVar9 = buflen;
        if ((pwVar3->enc).payload_remain == 0) {
LAB_001609b3:
          sVar11 = ws_enc_write_head(data,&pwVar3->enc,flags,sVar9,local_60,&local_64);
          CVar7 = local_64;
          if (sVar11 < 0) goto LAB_00160883;
        }
      }
      else {
        sVar9 = local_50;
        if (local_50 != 0) goto LAB_001609b3;
        if (((data != (CURL *)0x0) && ((pwVar3->enc).payload_remain < (long)buflen)) &&
           ((((data->set).field_0x8cd & 0x10) != 0 &&
            ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ))))) {
          Curl_infof(data,"WS: unaligned frame size (sending %zu instead of %ld)",buflen);
        }
      }
      local_38 = &pwVar3->enc;
      sVar10 = ws_enc_write_payload(local_38,data,(uchar *)local_58,buflen,local_60,&local_64);
      uVar4 = buflen;
      CVar7 = local_64;
      uVar5 = flags;
      sVar9 = sVar10;
      if (-1 < (long)sVar10) {
        do {
          do {
            local_40 = sVar9;
            local_44 = uVar5;
            buflen = uVar4;
LAB_00160a06:
            do {
              if (local_64 != CURLE_OK) goto LAB_00160b92;
              if ((buflen == 0) && (_Var6 = Curl_bufq_is_empty(local_60), _Var6)) {
LAB_00160b8f:
                buflen = 0;
                goto LAB_00160b92;
              }
              _Var6 = Curl_is_in_callback(data);
              local_64 = ws_flush(data,pwVar3,_Var6);
              q = local_60;
              if (local_64 == CURLE_AGAIN) {
                if (sVar10 < buflen) {
                  *sent = sVar10;
                  local_64 = CURLE_OK;
                  goto LAB_00160b92;
                }
                if (buflen == 0) {
                  *sent = local_40;
                  local_64 = ws_flush(data,pwVar3,true);
                  goto LAB_00160b8f;
                }
                *sent = sVar10 - 1;
                local_64 = Curl_bufq_unwrite(local_60,1);
                if (local_64 == CURLE_OK) {
                  local_64 = CURLE_AGAIN;
                }
                goto LAB_00160a06;
              }
            } while (local_64 != CURLE_OK);
            *sent = *sent + sVar10;
            local_58 = (websocket *)((local_58->dec).head + (sVar10 - 0x20));
            buflen = buflen - sVar10;
            sVar10 = 0;
            uVar4 = 0;
            uVar5 = local_44;
            sVar9 = local_40;
          } while (buflen == 0);
          local_40 = ws_enc_write_payload(local_38,data,(uchar *)local_58,buflen,local_60,&local_64)
          ;
          if ((long)local_40 < 0) goto LAB_00160b92;
          sVar10 = Curl_bufq_len(q);
          uVar4 = buflen;
          uVar5 = local_44;
          sVar9 = local_40;
        } while( true );
      }
      goto LAB_00160883;
    }
    fmt = "Not a websocket transfer";
  }
  Curl_failf(data,fmt);
  local_64 = CURLE_SEND_ERROR;
  CVar7 = local_64;
LAB_00160883:
  local_64 = CVar7;
  uVar1 = *(undefined8 *)&(data->set).field_0x8ca;
  if ((((uint)uVar1 >> 0x1c & 1) != 0) &&
     (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)) &&
      (0 < Curl_trc_feat_ws.log_level)))) {
    Curl_trc_ws(data,"curl_ws_send(len=%zu, fragsize=%ld, flags=%x, raw=%d) -> %d, %zu",buflen,
                fragsize,(ulong)flags,(ulong)((uint)((ulong)uVar1 >> 0x35) & 1),(ulong)local_64,
                *sent);
  }
  return local_64;
LAB_00160b92:
  fragsize = local_50;
  flags = local_44;
  CVar7 = local_64;
  if (data == (CURL *)0x0) {
    return local_64;
  }
  goto LAB_00160883;
}

Assistant:

CURL_EXTERN CURLcode curl_ws_send(CURL *data, const void *buffer,
                                  size_t buflen, size_t *sent,
                                  curl_off_t fragsize,
                                  unsigned int flags)
{
  struct websocket *ws;
  ssize_t n;
  size_t space, payload_added;
  CURLcode result;

  CURL_TRC_WS(data, "curl_ws_send(len=%zu, fragsize=%" FMT_OFF_T
              ", flags=%x), raw=%d",
              buflen, fragsize, flags, data->set.ws_raw_mode);
  *sent = 0;
  if(!data->conn && data->set.connect_only) {
    result = Curl_connect_only_attach(data);
    if(result)
      goto out;
  }
  if(!data->conn) {
    failf(data, "No associated connection");
    result = CURLE_SEND_ERROR;
    goto out;
  }
  if(!data->conn->proto.ws) {
    failf(data, "Not a websocket transfer");
    result = CURLE_SEND_ERROR;
    goto out;
  }
  ws = data->conn->proto.ws;

  /* try flushing any content still waiting to be sent. */
  result = ws_flush(data, ws, FALSE);
  if(result)
    goto out;

  if(data->set.ws_raw_mode) {
    /* In raw mode, we write directly to the connection */
    if(fragsize || flags) {
      failf(data, "ws_send, raw mode: fragsize and flags cannot be non-zero");
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    result = ws_send_raw(data, buffer, buflen, sent);
    goto out;
  }

  /* Not RAW mode, buf we do the frame encoding */
  space = Curl_bufq_space(&ws->sendbuf);
  CURL_TRC_WS(data, "curl_ws_send(len=%zu), sendbuf=%zu space_left=%zu",
              buflen, Curl_bufq_len(&ws->sendbuf), space);
  if(space < 14) {
    result = CURLE_AGAIN;
    goto out;
  }

  if(flags & CURLWS_OFFSET) {
    if(fragsize) {
      /* a frame series 'fragsize' bytes big, this is the first */
      n = ws_enc_write_head(data, &ws->enc, flags, fragsize,
                            &ws->sendbuf, &result);
      if(n < 0)
        goto out;
    }
    else {
      if((curl_off_t)buflen > ws->enc.payload_remain) {
        infof(data, "WS: unaligned frame size (sending %zu instead of %"
                    FMT_OFF_T ")",
              buflen, ws->enc.payload_remain);
      }
    }
  }
  else if(!ws->enc.payload_remain) {
    n = ws_enc_write_head(data, &ws->enc, flags, (curl_off_t)buflen,
                          &ws->sendbuf, &result);
    if(n < 0)
      goto out;
  }

  n = ws_enc_write_payload(&ws->enc, data,
                           buffer, buflen, &ws->sendbuf, &result);
  if(n < 0)
    goto out;
  payload_added = (size_t)n;

  while(!result && (buflen || !Curl_bufq_is_empty(&ws->sendbuf))) {
    /* flush, blocking when in callback */
    result = ws_flush(data, ws, Curl_is_in_callback(data));
    if(!result) {
      DEBUGASSERT(payload_added <= buflen);
      /* all buffered data sent. Try sending the rest if there is any. */
      *sent += payload_added;
      buffer = (const char *)buffer + payload_added;
      buflen -= payload_added;
      payload_added = 0;
      if(buflen) {
        n = ws_enc_write_payload(&ws->enc, data,
                                 buffer, buflen, &ws->sendbuf, &result);
        if(n < 0)
          goto out;
        payload_added = Curl_bufq_len(&ws->sendbuf);
      }
    }
    else if(result == CURLE_AGAIN) {
      /* partially sent. how much of the call data has been part of it? what
      * should we report to out caller so it can retry/send the rest? */
      if(payload_added < buflen) {
        /* We did not add everything the caller wanted. Return just
         * the partial write to our buffer. */
        *sent = payload_added;
        result = CURLE_OK;
        goto out;
      }
      else if(!buflen) {
        /* We have no payload to report a partial write. EAGAIN would make
         * the caller repeat this and add the frame again.
         * Flush blocking seems the only way out of this. */
        *sent = (size_t)n;
        result = ws_flush(data, ws, TRUE);
        goto out;
      }
      /* We added the complete data to our sendbuf. Report one byte less as
       * sent. This partial success should make the caller invoke us again
       * with the last byte. */
      *sent = payload_added - 1;
      result = Curl_bufq_unwrite(&ws->sendbuf, 1);
      if(!result)
        result = CURLE_AGAIN;
    }
  }

out:
  CURL_TRC_WS(data, "curl_ws_send(len=%zu, fragsize=%" FMT_OFF_T
              ", flags=%x, raw=%d) -> %d, %zu",
              buflen, fragsize, flags, data->set.ws_raw_mode, result, *sent);
  return result;
}